

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O0

void __thiscall Js::JavascriptSet::Add(JavascriptSet *this,Var value)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this_00;
  ThreadContext *threadContext;
  Var value_00;
  undefined4 *puVar3;
  Var simpleVar;
  undefined1 local_38 [8];
  JsReentLock jsReentLock;
  Var value_local;
  JavascriptSet *this_local;
  
  jsReentLock._24_8_ = value;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  threadContext = ScriptContext::GetThreadContext(this_00);
  JsReentLock::JsReentLock((JsReentLock *)local_38,threadContext);
  switch(this->kind) {
  case EmptySet:
    AddToEmptySet(this,(Var)jsReentLock._24_8_);
    break;
  case IntSet:
    bVar2 = TryAddToIntSet(this,(Var)jsReentLock._24_8_);
    if (!bVar2) {
      value_00 = JavascriptConversion::TryCanonicalizeAsSimpleVar<false>((Var)jsReentLock._24_8_);
      if (value_00 == (Var)0x0) {
        PromoteToComplexVarSet(this);
        Add(this,(Var)jsReentLock._24_8_);
      }
      else {
        PromoteToSimpleVarSet(this);
        Add(this,value_00);
      }
    }
    break;
  case SimpleVarSet:
    bVar2 = TryAddToSimpleVarSet(this,(Var)jsReentLock._24_8_);
    if (!bVar2) {
      PromoteToComplexVarSet(this);
      Add(this,(Var)jsReentLock._24_8_);
    }
    break;
  case ComplexVarSet:
    AddToComplexVarSet(this,(Var)jsReentLock._24_8_);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x1c4,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_38);
  return;
}

Assistant:

void
JavascriptSet::Add(Var value)
{
    JS_REENTRANCY_LOCK(jsReentLock, this->GetScriptContext()->GetThreadContext());
    switch (this->kind)
    {
    case SetKind::EmptySet:
    {
        this->AddToEmptySet(value);
        return;
    }

    case SetKind::IntSet:
    {
        if (this->TryAddToIntSet(value))
        {
            return;
        }

        Var simpleVar = JavascriptConversion::TryCanonicalizeAsSimpleVar<false /* allowLossyConversion */>(value);
        if (simpleVar)
        {
            this->PromoteToSimpleVarSet();
            this->Add(simpleVar);
            return;
        }

        this->PromoteToComplexVarSet();
        this->Add(value);
        return;
    }

    case SetKind::SimpleVarSet:
        if (this->TryAddToSimpleVarSet(value))
        {
            return;
        }

        this->PromoteToComplexVarSet();
        this->Add(value);
        return;

    case SetKind::ComplexVarSet:
        this->AddToComplexVarSet(value);
        return;

    default:
        Assume(UNREACHED);
    }
}